

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  AssertionPrinter *this_00;
  StringRef passOrFail;
  int iVar2;
  size_type sVar3;
  Code CVar4;
  char *pcVar5;
  size_type in_R9;
  StringRef rhs;
  StringRef passOrFail_00;
  StringRef passOrFail_01;
  StringRef passOrFail_02;
  StringRef passOrFail_03;
  StringRef passOrFail_04;
  StringRef passOrFail_05;
  StringRef passOrFail_06;
  StringRef passOrFail_07;
  StringRef lhs;
  AssertionPrinter printer;
  char local_79;
  AssertionPrinter local_78;
  undefined1 local_48 [12];
  uint uStack_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  SourceLineInfo local_28;
  
  iVar2 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[4])();
  local_78.printInfoMessages = true;
  if (((char)iVar2 == '\0') &&
     ((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
      (OVar1 & FailureBit) == Ok ||
      (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    local_78.printInfoMessages = false;
    if ((OVar1 != ExplicitSkip) && (local_78.printInfoMessages = false, OVar1 != Warning)) {
      return;
    }
  }
  this_00 = (AssertionPrinter *)(this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  local_78.colourImpl = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  local_78.messages = &_assertionStats->infoMessages;
  local_78.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48[0] = (char)local_78.colourImpl;
  local_48._1_7_ = (undefined7)((ulong)local_78.colourImpl >> 8);
  local_48._8_4_ = FileName;
  uStack_3c = uStack_3c & 0xffffff00;
  local_78.stream = (ostream *)this_00;
  local_78.result = &_assertionStats->assertionResult;
  ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_48,(ostream *)this_00);
  local_28.file = (_assertionStats->assertionResult).m_info.lineInfo.file;
  local_28.line = (_assertionStats->assertionResult).m_info.lineInfo.line;
  operator<<((ostream *)this_00,&local_28);
  local_79 = ':';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_79,1);
  if (uStack_3c._0_1_ == true) {
    (**(code **)(*(long *)CONCAT71(local_48._1_7_,local_48[0]) + 0x10))();
  }
  local_78.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  OVar1 = (_assertionStats->assertionResult).m_resultData.resultType;
  if (0x10f < OVar1) {
    if (OVar1 < DidntThrowException) {
      if (OVar1 == Exception) goto switchD_0015e85c_caseD_ffffffff;
      if (OVar1 != ThrewException) goto switchD_0015e85c_caseD_3;
      passOrFail_01.m_size = 6;
      passOrFail_01.m_start = "failed";
      anon_unknown_26::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_01);
      pcVar5 = "unexpected exception with message:";
LAB_0015e93c:
      anon_unknown_26::AssertionPrinter::printIssue(this_00,pcVar5);
      anon_unknown_26::AssertionPrinter::printMessage(&local_78);
    }
    else {
      if (OVar1 != DidntThrowException) {
        if (OVar1 != FatalErrorCondition) goto switchD_0015e85c_caseD_3;
        passOrFail_03.m_size = 6;
        passOrFail_03.m_start = "failed";
        anon_unknown_26::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_03);
        pcVar5 = "fatal error condition with message:";
        goto LAB_0015e93c;
      }
      passOrFail_07.m_size = 6;
      passOrFail_07.m_start = "failed";
      anon_unknown_26::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_07);
      anon_unknown_26::AssertionPrinter::printIssue(this_00,"expected exception, got none");
    }
    anon_unknown_26::AssertionPrinter::printExpressionWas(&local_78);
    goto LAB_0015eab0;
  }
  switch(OVar1) {
  case Ok:
    passOrFail_00.m_size = 6;
    passOrFail_00.m_start = "passed";
    anon_unknown_26::AssertionPrinter::printResultType(&local_78,BrightGreen,passOrFail_00);
    anon_unknown_26::AssertionPrinter::printOriginalExpression(&local_78);
    anon_unknown_26::AssertionPrinter::printReconstructedExpression(&local_78);
    if ((_assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) goto LAB_0015eab0;
    break;
  case Info:
    pcVar5 = "info";
    sVar3 = 4;
    goto LAB_0015e9d5;
  case Warning:
    pcVar5 = "warning";
    sVar3 = 7;
LAB_0015e9d5:
    CVar4 = None;
LAB_0015e9f5:
    passOrFail_06.m_size = sVar3;
    passOrFail_06.m_start = pcVar5;
    anon_unknown_26::AssertionPrinter::printResultType(&local_78,CVar4,passOrFail_06);
    anon_unknown_26::AssertionPrinter::printMessage(&local_78);
LAB_0015eab0:
    CVar4 = FileName;
    goto LAB_0015eab5;
  default:
    goto switchD_0015e85c_caseD_3;
  case ExplicitSkip:
    pcVar5 = "skipped";
    sVar3 = 7;
    CVar4 = FileName;
    goto LAB_0015e9f5;
  case ExpressionFailed:
    if (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0) {
      passOrFail_05.m_size = 6;
      passOrFail_05.m_start = "failed";
      anon_unknown_26::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_05);
    }
    else {
      rhs.m_size = in_R9;
      rhs.m_start = (char *)0xd;
      lhs.m_size = (size_type)" - but was ok";
      lhs.m_start = (char *)0x6;
      operator+[abi_cxx11_((string *)local_48,(Catch *)0x2a19e0,lhs,rhs);
      passOrFail.m_start._1_7_ = local_48._1_7_;
      passOrFail.m_start._0_1_ = local_48[0];
      passOrFail.m_size._0_4_ = local_48._8_4_;
      passOrFail.m_size._4_4_ = uStack_3c;
      anon_unknown_26::AssertionPrinter::printResultType(&local_78,BrightGreen,passOrFail);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_48._1_7_,local_48[0]) != &local_38) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_48._1_7_,local_48[0]),local_38._M_allocated_capacity + 1);
      }
    }
    anon_unknown_26::AssertionPrinter::printOriginalExpression(&local_78);
    anon_unknown_26::AssertionPrinter::printReconstructedExpression(&local_78);
    goto LAB_0015eab0;
  case ExplicitFailure:
    passOrFail_04.m_size = 6;
    passOrFail_04.m_start = "failed";
    anon_unknown_26::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_04);
    anon_unknown_26::AssertionPrinter::printIssue(this_00,"explicitly");
    break;
  case Unknown:
  case FailureBit:
switchD_0015e85c_caseD_ffffffff:
    passOrFail_02.m_size = 0x14;
    passOrFail_02.m_start = "** internal error **";
    anon_unknown_26::AssertionPrinter::printResultType(&local_78,BrightRed,passOrFail_02);
    goto switchD_0015e85c_caseD_3;
  }
  CVar4 = None;
LAB_0015eab5:
  anon_unknown_26::AssertionPrinter::printRemainingMessages(&local_78,CVar4);
switchD_0015e85c_caseD_3:
  local_48[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,local_48,1);
  std::ostream::flush();
  return;
}

Assistant:

void CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning && result.getResultType() != ResultWas::ExplicitSkip )
                    return;
                printInfoMessages = false;
            }

            AssertionPrinter printer( m_stream, _assertionStats, printInfoMessages, m_colour.get() );
            printer.print();

            m_stream << '\n' << std::flush;
        }